

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base_eval.cpp
# Opt level: O3

Vec3<embree::vfloat_impl<4>_> *
embree::sse2::patchEval<embree::vfloat_impl<4>>
          (SubdivPatch1Base *patch,vfloat_impl<4> *uu,vfloat_impl<4> *vv)

{
  uchar uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  Vec3<embree::vfloat_impl<4>_> *in_RDI;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar53 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar73 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar83 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  uint uVar126;
  float fVar127;
  uint uVar128;
  float fVar129;
  uint uVar130;
  float fVar131;
  uint uVar132;
  float fVar133;
  
  uVar1 = patch->type;
  if (uVar1 == '\x02') {
    fVar93 = (uu->field_0).v[0];
    fVar94 = (uu->field_0).v[1];
    fVar95 = (uu->field_0).v[2];
    fVar96 = (uu->field_0).v[3];
    fVar50 = 1.0 - fVar93;
    fVar54 = 1.0 - fVar94;
    fVar57 = 1.0 - fVar95;
    fVar61 = 1.0 - fVar96;
    fVar80 = (vv->field_0).v[0];
    fVar84 = (vv->field_0).v[1];
    fVar87 = (vv->field_0).v[2];
    fVar90 = (vv->field_0).v[3];
    fVar9 = 1.0 - fVar80;
    fVar14 = 1.0 - fVar84;
    fVar18 = 1.0 - fVar87;
    fVar22 = 1.0 - fVar90;
    fVar42 = fVar50 * fVar50 * fVar50;
    fVar44 = fVar54 * fVar54 * fVar54;
    fVar46 = fVar57 * fVar57 * fVar57;
    fVar48 = fVar61 * fVar61 * fVar61;
    fVar26 = fVar9 * fVar9 * fVar9;
    fVar30 = fVar14 * fVar14 * fVar14;
    fVar34 = fVar18 * fVar18 * fVar18;
    fVar38 = fVar22 * fVar22 * fVar22;
    fVar51 = fVar50 * fVar93 * fVar50 * 3.0;
    fVar55 = fVar54 * fVar94 * fVar54 * 3.0;
    fVar58 = fVar57 * fVar95 * fVar57 * 3.0;
    fVar62 = fVar61 * fVar96 * fVar61 * 3.0;
    fVar10 = fVar9 * fVar80 * fVar9 * 3.0;
    fVar15 = fVar14 * fVar84 * fVar14 * 3.0;
    fVar19 = fVar18 * fVar87 * fVar18 * 3.0;
    fVar23 = fVar22 * fVar90 * fVar22 * 3.0;
    fVar71 = fVar93 * fVar50 * fVar93 * 3.0;
    fVar74 = fVar94 * fVar54 * fVar94 * 3.0;
    fVar76 = fVar95 * fVar57 * fVar95 * 3.0;
    fVar78 = fVar96 * fVar61 * fVar96 * 3.0;
    fVar64 = fVar80 * fVar9 * fVar80 * 3.0;
    fVar66 = fVar84 * fVar14 * fVar84 * 3.0;
    fVar68 = fVar87 * fVar18 * fVar87 * 3.0;
    fVar70 = fVar90 * fVar22 * fVar90 * 3.0;
    fVar93 = fVar93 * fVar93 * fVar93;
    fVar94 = fVar94 * fVar94 * fVar94;
    fVar95 = fVar95 * fVar95 * fVar95;
    fVar96 = fVar96 * fVar96 * fVar96;
    fVar80 = fVar80 * fVar80 * fVar80;
    fVar84 = fVar84 * fVar84 * fVar84;
    fVar87 = fVar87 * fVar87 * fVar87;
    fVar90 = fVar90 * fVar90 * fVar90;
    fVar14 = patch->patch_v[0][0].field_0.m128[0];
    fVar18 = patch->patch_v[0][1].field_0.m128[0];
    fVar22 = patch->patch_v[0][2].field_0.m128[0];
    fVar50 = patch->patch_v[0][3].field_0.m128[0];
    fVar54 = patch->patch_v[1][0].field_0.m128[0];
    fVar57 = patch->patch_v[1][1].field_0.m128[0];
    fVar61 = patch->patch_v[1][2].field_0.m128[0];
    fVar52 = patch->patch_v[1][3].field_0.m128[0];
    fVar56 = patch->patch_v[2][0].field_0.m128[0];
    fVar60 = patch->patch_v[2][1].field_0.m128[0];
    fVar65 = patch->patch_v[2][2].field_0.m128[0];
    fVar67 = patch->patch_v[2][3].field_0.m128[0];
    fVar69 = patch->patch_v[3][2].field_0.m128[0];
    fVar72 = patch->patch_v[3][3].field_0.m128[0];
    fVar9 = patch->patch_v[3][3].field_0.m128[1];
    fVar75 = patch->patch_v[3][1].field_0.m128[0];
    fVar77 = patch->patch_v[3][0].field_0.m128[0];
    fVar79 = patch->patch_v[0][0].field_0.m128[1];
    fVar2 = patch->patch_v[0][1].field_0.m128[1];
    fVar3 = patch->patch_v[0][2].field_0.m128[1];
    fVar4 = patch->patch_v[0][3].field_0.m128[1];
    fVar5 = patch->patch_v[1][0].field_0.m128[1];
    fVar6 = patch->patch_v[1][2].field_0.m128[1];
    fVar7 = patch->patch_v[1][3].field_0.m128[1];
    fVar11 = patch->patch_v[1][1].field_0.m128[1];
    fVar16 = patch->patch_v[2][2].field_0.m128[1];
    fVar20 = patch->patch_v[2][3].field_0.m128[1];
    fVar24 = patch->patch_v[2][1].field_0.m128[1];
    fVar27 = patch->patch_v[2][0].field_0.m128[1];
    fVar31 = patch->patch_v[3][2].field_0.m128[1];
    fVar35 = patch->patch_v[3][1].field_0.m128[1];
    fVar39 = patch->patch_v[3][0].field_0.m128[1];
    fVar97 = (fVar79 * fVar42 + fVar2 * fVar51 + fVar3 * fVar71 + fVar4 * fVar93) * fVar26 +
             (fVar5 * fVar42 + fVar11 * fVar51 + fVar6 * fVar71 + fVar7 * fVar93) * fVar10 +
             (fVar27 * fVar42 + fVar24 * fVar51 + fVar16 * fVar71 + fVar20 * fVar93) * fVar64 +
             (fVar39 * fVar42 + fVar35 * fVar51 + fVar31 * fVar71 + fVar9 * fVar93) * fVar80;
    fVar100 = (fVar79 * fVar44 + fVar2 * fVar55 + fVar3 * fVar74 + fVar4 * fVar94) * fVar30 +
              (fVar5 * fVar44 + fVar11 * fVar55 + fVar6 * fVar74 + fVar7 * fVar94) * fVar15 +
              (fVar27 * fVar44 + fVar24 * fVar55 + fVar16 * fVar74 + fVar20 * fVar94) * fVar66 +
              (fVar39 * fVar44 + fVar35 * fVar55 + fVar31 * fVar74 + fVar9 * fVar94) * fVar84;
    fVar103 = (fVar79 * fVar46 + fVar2 * fVar58 + fVar3 * fVar76 + fVar4 * fVar95) * fVar34 +
              (fVar5 * fVar46 + fVar11 * fVar58 + fVar6 * fVar76 + fVar7 * fVar95) * fVar19 +
              (fVar27 * fVar46 + fVar24 * fVar58 + fVar16 * fVar76 + fVar20 * fVar95) * fVar68 +
              (fVar39 * fVar46 + fVar35 * fVar58 + fVar31 * fVar76 + fVar9 * fVar95) * fVar87;
    fVar106 = (fVar79 * fVar48 + fVar2 * fVar62 + fVar3 * fVar78 + fVar4 * fVar96) * fVar38 +
              (fVar5 * fVar48 + fVar11 * fVar62 + fVar6 * fVar78 + fVar7 * fVar96) * fVar23 +
              (fVar27 * fVar48 + fVar24 * fVar62 + fVar16 * fVar78 + fVar20 * fVar96) * fVar70 +
              (fVar39 * fVar48 + fVar35 * fVar62 + fVar31 * fVar78 + fVar9 * fVar96) * fVar90;
    fVar79 = patch->patch_v[0][0].field_0.m128[2];
    fVar2 = patch->patch_v[0][1].field_0.m128[2];
    fVar3 = patch->patch_v[0][2].field_0.m128[2];
    fVar4 = patch->patch_v[0][3].field_0.m128[2];
    fVar5 = patch->patch_v[1][0].field_0.m128[2];
    fVar6 = patch->patch_v[1][2].field_0.m128[2];
    fVar7 = patch->patch_v[1][3].field_0.m128[2];
    fVar11 = patch->patch_v[1][1].field_0.m128[2];
    fVar16 = patch->patch_v[2][2].field_0.m128[2];
    fVar20 = patch->patch_v[2][3].field_0.m128[2];
    fVar24 = patch->patch_v[2][1].field_0.m128[2];
    fVar27 = patch->patch_v[2][0].field_0.m128[2];
    fVar9 = patch->patch_v[3][3].field_0.m128[2];
    fVar31 = patch->patch_v[3][2].field_0.m128[2];
    fVar35 = patch->patch_v[3][1].field_0.m128[2];
    fVar39 = patch->patch_v[3][0].field_0.m128[2];
    fVar109 = (fVar79 * fVar42 + fVar2 * fVar51 + fVar3 * fVar71 + fVar4 * fVar93) * fVar26 +
              (fVar5 * fVar42 + fVar11 * fVar51 + fVar6 * fVar71 + fVar7 * fVar93) * fVar10 +
              (fVar27 * fVar42 + fVar24 * fVar51 + fVar16 * fVar71 + fVar20 * fVar93) * fVar64 +
              (fVar39 * fVar42 + fVar35 * fVar51 + fVar31 * fVar71 + fVar9 * fVar93) * fVar80;
    fVar112 = (fVar79 * fVar44 + fVar2 * fVar55 + fVar3 * fVar74 + fVar4 * fVar94) * fVar30 +
              (fVar5 * fVar44 + fVar11 * fVar55 + fVar6 * fVar74 + fVar7 * fVar94) * fVar15 +
              (fVar27 * fVar44 + fVar24 * fVar55 + fVar16 * fVar74 + fVar20 * fVar94) * fVar66 +
              (fVar39 * fVar44 + fVar35 * fVar55 + fVar31 * fVar74 + fVar9 * fVar94) * fVar84;
    fVar115 = (fVar79 * fVar46 + fVar2 * fVar58 + fVar3 * fVar76 + fVar4 * fVar95) * fVar34 +
              (fVar5 * fVar46 + fVar11 * fVar58 + fVar6 * fVar76 + fVar7 * fVar95) * fVar19 +
              (fVar27 * fVar46 + fVar24 * fVar58 + fVar16 * fVar76 + fVar20 * fVar95) * fVar68 +
              (fVar39 * fVar46 + fVar35 * fVar58 + fVar31 * fVar76 + fVar9 * fVar95) * fVar87;
    fVar9 = (fVar79 * fVar48 + fVar2 * fVar62 + fVar3 * fVar78 + fVar4 * fVar96) * fVar38 +
            (fVar5 * fVar48 + fVar11 * fVar62 + fVar6 * fVar78 + fVar7 * fVar96) * fVar23 +
            (fVar27 * fVar48 + fVar24 * fVar62 + fVar16 * fVar78 + fVar20 * fVar96) * fVar70 +
            (fVar39 * fVar48 + fVar35 * fVar62 + fVar31 * fVar78 + fVar9 * fVar96) * fVar90;
    *(float *)&in_RDI->field_0 =
         (fVar14 * fVar42 + fVar18 * fVar51 + fVar22 * fVar71 + fVar50 * fVar93) * fVar26 +
         (fVar54 * fVar42 + fVar57 * fVar51 + fVar61 * fVar71 + fVar52 * fVar93) * fVar10 +
         (fVar56 * fVar42 + fVar60 * fVar51 + fVar65 * fVar71 + fVar67 * fVar93) * fVar64 +
         (fVar77 * fVar42 + fVar75 * fVar51 + fVar69 * fVar71 + fVar72 * fVar93) * fVar80;
    *(float *)((long)&in_RDI->field_0 + 4) =
         (fVar14 * fVar44 + fVar18 * fVar55 + fVar22 * fVar74 + fVar50 * fVar94) * fVar30 +
         (fVar54 * fVar44 + fVar57 * fVar55 + fVar61 * fVar74 + fVar52 * fVar94) * fVar15 +
         (fVar56 * fVar44 + fVar60 * fVar55 + fVar65 * fVar74 + fVar67 * fVar94) * fVar66 +
         (fVar77 * fVar44 + fVar75 * fVar55 + fVar69 * fVar74 + fVar72 * fVar94) * fVar84;
    *(float *)((long)&in_RDI->field_0 + 8) =
         (fVar14 * fVar46 + fVar18 * fVar58 + fVar22 * fVar76 + fVar50 * fVar95) * fVar34 +
         (fVar54 * fVar46 + fVar57 * fVar58 + fVar61 * fVar76 + fVar52 * fVar95) * fVar19 +
         (fVar56 * fVar46 + fVar60 * fVar58 + fVar65 * fVar76 + fVar67 * fVar95) * fVar68 +
         (fVar77 * fVar46 + fVar75 * fVar58 + fVar69 * fVar76 + fVar72 * fVar95) * fVar87;
    *(float *)((long)&in_RDI->field_0 + 0xc) =
         (fVar14 * fVar48 + fVar18 * fVar62 + fVar22 * fVar78 + fVar50 * fVar96) * fVar38 +
         (fVar54 * fVar48 + fVar57 * fVar62 + fVar61 * fVar78 + fVar52 * fVar96) * fVar23 +
         (fVar56 * fVar48 + fVar60 * fVar62 + fVar65 * fVar78 + fVar67 * fVar96) * fVar70 +
         (fVar77 * fVar48 + fVar75 * fVar62 + fVar69 * fVar78 + fVar72 * fVar96) * fVar90;
  }
  else {
    if (uVar1 != '\x01') {
      if (uVar1 == '\x03') {
        fVar93 = patch->patch_v[0][0].field_0.m128[3];
        fVar94 = patch->patch_v[0][1].field_0.m128[3];
        fVar95 = patch->patch_v[0][2].field_0.m128[3];
        fVar96 = (uu->field_0).v[0];
        fVar80 = (uu->field_0).v[1];
        fVar84 = (uu->field_0).v[2];
        fVar87 = (uu->field_0).v[3];
        fVar98 = 1.0 - fVar96;
        fVar101 = 1.0 - fVar80;
        fVar104 = 1.0 - fVar84;
        fVar107 = 1.0 - fVar87;
        fVar90 = (vv->field_0).v[0];
        fVar14 = (vv->field_0).v[1];
        fVar18 = (vv->field_0).v[2];
        fVar22 = (vv->field_0).v[3];
        uVar126 = -(uint)((fVar90 != 0.0 && fVar90 != 1.0) && (fVar96 != 1.0 && fVar96 != 0.0));
        uVar128 = -(uint)((fVar14 != 0.0 && fVar14 != 1.0) && (fVar80 != 1.0 && fVar80 != 0.0));
        uVar130 = -(uint)((fVar18 != 0.0 && fVar18 != 1.0) && (fVar84 != 1.0 && fVar84 != 0.0));
        uVar132 = -(uint)((fVar22 != 0.0 && fVar22 != 1.0) && (fVar87 != 1.0 && fVar87 != 0.0));
        fVar50 = patch->patch_v[1][1].field_0.m128[0];
        fVar54 = patch->patch_v[1][1].field_0.m128[1];
        auVar12._4_4_ = fVar54;
        auVar12._0_4_ = fVar54;
        auVar12._8_4_ = fVar54;
        auVar12._12_4_ = fVar54;
        fVar57 = patch->patch_v[1][1].field_0.m128[2];
        auVar13._4_4_ = fVar80 + fVar14;
        auVar13._0_4_ = fVar96 + fVar90;
        auVar13._8_4_ = fVar84 + fVar18;
        auVar13._12_4_ = fVar87 + fVar22;
        auVar13 = rcpps(auVar12,auVar13);
        fVar109 = auVar13._0_4_;
        fVar115 = auVar13._4_4_;
        fVar59 = auVar13._8_4_;
        fVar63 = auVar13._12_4_;
        fVar61 = patch->patch_v[1][0].field_0.m128[3];
        fVar109 = (1.0 - (fVar96 + fVar90) * fVar109) * fVar109 + fVar109;
        fVar115 = (1.0 - (fVar80 + fVar14) * fVar115) * fVar115 + fVar115;
        fVar59 = (1.0 - (fVar84 + fVar18) * fVar59) * fVar59 + fVar59;
        fVar63 = (1.0 - (fVar87 + fVar22) * fVar63) * fVar63 + fVar63;
        fVar52 = patch->patch_v[1][1].field_0.m128[3];
        fVar56 = patch->patch_v[1][2].field_0.m128[0];
        fVar60 = patch->patch_v[1][2].field_0.m128[1];
        fVar81 = 1.0 - fVar90;
        fVar85 = 1.0 - fVar14;
        fVar88 = 1.0 - fVar18;
        fVar91 = 1.0 - fVar22;
        fVar65 = patch->patch_v[3][0].field_0.m128[3];
        fVar67 = patch->patch_v[3][1].field_0.m128[3];
        fVar69 = patch->patch_v[3][2].field_0.m128[3];
        fVar72 = patch->patch_v[1][2].field_0.m128[3];
        fVar28 = fVar98 * fVar98 * fVar98;
        fVar32 = fVar101 * fVar101 * fVar101;
        fVar36 = fVar104 * fVar104 * fVar104;
        fVar40 = fVar107 * fVar107 * fVar107;
        fVar112 = fVar96 * fVar96 * fVar96;
        fVar17 = fVar80 * fVar80 * fVar80;
        fVar21 = fVar84 * fVar84 * fVar84;
        fVar25 = fVar87 * fVar87 * fVar87;
        fVar75 = patch->patch_v[2][0].field_0.m128[3];
        fVar77 = patch->patch_v[2][1].field_0.m128[3];
        fVar79 = patch->patch_v[2][2].field_0.m128[3];
        auVar120._0_4_ = fVar98 + fVar81;
        auVar120._4_4_ = fVar101 + fVar85;
        auVar120._8_4_ = fVar104 + fVar88;
        auVar120._12_4_ = fVar107 + fVar91;
        auVar53._0_4_ = fVar96 + fVar81;
        auVar53._4_4_ = fVar80 + fVar85;
        auVar53._8_4_ = fVar84 + fVar88;
        auVar53._12_4_ = fVar87 + fVar91;
        fVar29 = fVar81 * fVar81 * fVar81;
        fVar33 = fVar85 * fVar85 * fVar85;
        fVar37 = fVar88 * fVar88 * fVar88;
        fVar41 = fVar91 * fVar91 * fVar91;
        auVar83._0_4_ = fVar90 * fVar90 * fVar90;
        auVar83._4_4_ = fVar14 * fVar14 * fVar14;
        auVar83._8_4_ = fVar18 * fVar18 * fVar18;
        auVar83._12_4_ = fVar22 * fVar22 * fVar22;
        fVar2 = patch->patch_v[1][2].field_0.m128[2];
        auVar8._4_4_ = fVar101 + fVar14;
        auVar8._0_4_ = fVar98 + fVar90;
        auVar8._8_4_ = fVar104 + fVar18;
        auVar8._12_4_ = fVar107 + fVar22;
        auVar13 = rcpps(auVar83,auVar8);
        fVar122 = auVar13._0_4_;
        fVar123 = auVar13._4_4_;
        fVar124 = auVar13._8_4_;
        fVar125 = auVar13._12_4_;
        fVar122 = (1.0 - (fVar98 + fVar90) * fVar122) * fVar122 + fVar122;
        fVar123 = (1.0 - (fVar101 + fVar14) * fVar123) * fVar123 + fVar123;
        fVar124 = (1.0 - (fVar104 + fVar18) * fVar124) * fVar124 + fVar124;
        fVar125 = (1.0 - (fVar107 + fVar22) * fVar125) * fVar125 + fVar125;
        fVar3 = patch->patch_v[2][2].field_0.m128[0];
        fVar4 = patch->patch_v[2][2].field_0.m128[1];
        fVar5 = patch->patch_v[2][2].field_0.m128[2];
        auVar73._4_4_ = fVar5;
        auVar73._0_4_ = fVar5;
        auVar73._8_4_ = fVar5;
        auVar73._12_4_ = fVar5;
        auVar13 = rcpps(auVar73,auVar120);
        fVar110 = auVar13._0_4_;
        auVar121._0_4_ = auVar120._0_4_ * fVar110;
        fVar113 = auVar13._4_4_;
        auVar121._4_4_ = auVar120._4_4_ * fVar113;
        fVar116 = auVar13._8_4_;
        auVar121._8_4_ = auVar120._8_4_ * fVar116;
        fVar118 = auVar13._12_4_;
        auVar121._12_4_ = auVar120._12_4_ * fVar118;
        fVar110 = (1.0 - auVar121._0_4_) * fVar110 + fVar110;
        fVar113 = (1.0 - auVar121._4_4_) * fVar113 + fVar113;
        fVar116 = (1.0 - auVar121._8_4_) * fVar116 + fVar116;
        fVar118 = (1.0 - auVar121._12_4_) * fVar118 + fVar118;
        fVar6 = patch->patch_v[2][1].field_0.m128[0];
        fVar7 = patch->patch_v[2][1].field_0.m128[1];
        fVar11 = patch->patch_v[2][1].field_0.m128[2];
        auVar13 = rcpps(auVar121,auVar53);
        fVar82 = auVar13._0_4_;
        fVar86 = auVar13._4_4_;
        fVar89 = auVar13._8_4_;
        fVar92 = auVar13._12_4_;
        fVar82 = (1.0 - auVar53._0_4_ * fVar82) * fVar82 + fVar82;
        fVar86 = (1.0 - auVar53._4_4_ * fVar86) * fVar86 + fVar86;
        fVar89 = (1.0 - auVar53._8_4_ * fVar89) * fVar89 + fVar89;
        fVar92 = (1.0 - auVar53._12_4_ * fVar92) * fVar92 + fVar92;
        fVar127 = fVar98 * fVar96 * fVar98 * 3.0;
        fVar129 = fVar101 * fVar80 * fVar101 * 3.0;
        fVar131 = fVar104 * fVar84 * fVar104 * 3.0;
        fVar133 = fVar107 * fVar87 * fVar107 * 3.0;
        fVar99 = fVar81 * fVar90 * fVar81 * 3.0;
        fVar102 = fVar85 * fVar14 * fVar85 * 3.0;
        fVar105 = fVar88 * fVar18 * fVar88 * 3.0;
        fVar108 = fVar91 * fVar22 * fVar91 * 3.0;
        fVar111 = fVar96 * fVar98 * fVar96 * 3.0;
        fVar114 = fVar80 * fVar101 * fVar80 * 3.0;
        fVar117 = fVar84 * fVar104 * fVar84 * 3.0;
        fVar119 = fVar87 * fVar107 * fVar87 * 3.0;
        fVar43 = fVar90 * fVar81 * fVar90 * 3.0;
        fVar45 = fVar14 * fVar85 * fVar14 * 3.0;
        fVar47 = fVar18 * fVar88 * fVar18 * 3.0;
        fVar49 = fVar22 * fVar91 * fVar22 * 3.0;
        fVar16 = patch->patch_v[0][2].field_0.m128[0];
        fVar20 = patch->patch_v[0][3].field_0.m128[0];
        fVar24 = patch->patch_v[0][1].field_0.m128[0];
        fVar27 = patch->patch_v[0][0].field_0.m128[0];
        fVar31 = patch->patch_v[1][3].field_0.m128[0];
        fVar35 = patch->patch_v[1][0].field_0.m128[0];
        fVar39 = patch->patch_v[2][3].field_0.m128[0];
        fVar10 = patch->patch_v[2][0].field_0.m128[0];
        fVar15 = patch->patch_v[3][2].field_0.m128[0];
        fVar19 = patch->patch_v[3][3].field_0.m128[0];
        fVar23 = patch->patch_v[3][3].field_0.m128[1];
        fVar26 = patch->patch_v[3][1].field_0.m128[0];
        fVar30 = patch->patch_v[3][0].field_0.m128[0];
        fVar34 = patch->patch_v[0][2].field_0.m128[1];
        fVar38 = patch->patch_v[0][3].field_0.m128[1];
        fVar42 = patch->patch_v[0][1].field_0.m128[1];
        fVar44 = patch->patch_v[0][0].field_0.m128[1];
        fVar46 = patch->patch_v[1][3].field_0.m128[1];
        fVar48 = patch->patch_v[1][0].field_0.m128[1];
        fVar51 = patch->patch_v[2][3].field_0.m128[1];
        fVar55 = patch->patch_v[2][0].field_0.m128[1];
        fVar58 = patch->patch_v[3][2].field_0.m128[1];
        fVar62 = patch->patch_v[3][1].field_0.m128[1];
        fVar64 = patch->patch_v[3][0].field_0.m128[1];
        fVar66 = patch->patch_v[0][2].field_0.m128[2];
        fVar68 = patch->patch_v[0][3].field_0.m128[2];
        fVar70 = patch->patch_v[0][1].field_0.m128[2];
        fVar71 = patch->patch_v[0][0].field_0.m128[2];
        fVar74 = patch->patch_v[1][3].field_0.m128[2];
        fVar76 = patch->patch_v[1][0].field_0.m128[2];
        fVar78 = patch->patch_v[2][3].field_0.m128[2];
        fVar97 = patch->patch_v[2][0].field_0.m128[2];
        fVar9 = patch->patch_v[3][3].field_0.m128[2];
        fVar100 = patch->patch_v[3][2].field_0.m128[2];
        fVar103 = patch->patch_v[3][1].field_0.m128[2];
        fVar106 = patch->patch_v[3][0].field_0.m128[2];
        *(float *)&in_RDI->field_0 =
             (fVar27 * fVar28 + fVar24 * fVar127 + fVar16 * fVar111 + fVar20 * fVar112) * fVar29 +
             (fVar35 * fVar28 +
             (float)(~uVar126 & (uint)fVar50 |
                    (uint)((fVar93 * fVar90 + fVar96 * fVar50) * fVar109) & uVar126) * fVar127 +
             (float)(~uVar126 & (uint)fVar56 |
                    (uint)((fVar90 * fVar56 + fVar61 * fVar98) * fVar122) & uVar126) * fVar111 +
             fVar31 * fVar112) * fVar99 +
             (fVar10 * fVar28 +
             (float)(~uVar126 & (uint)fVar6 |
                    (uint)((fVar81 * fVar6 + fVar65 * fVar96) * fVar82) & uVar126) * fVar127 +
             (float)(~uVar126 & (uint)fVar3 |
                    (uint)((fVar75 * fVar81 + fVar98 * fVar3) * fVar110) & uVar126) * fVar111 +
             fVar39 * fVar112) * fVar43 +
             (fVar30 * fVar28 + fVar26 * fVar127 + fVar15 * fVar111 + fVar19 * fVar112) *
             auVar83._0_4_;
        *(float *)((long)&in_RDI->field_0 + 4) =
             (fVar27 * fVar32 + fVar24 * fVar129 + fVar16 * fVar114 + fVar20 * fVar17) * fVar33 +
             (fVar35 * fVar32 +
             (float)(~uVar128 & (uint)fVar50 |
                    (uint)((fVar93 * fVar14 + fVar80 * fVar50) * fVar115) & uVar128) * fVar129 +
             (float)(~uVar128 & (uint)fVar56 |
                    (uint)((fVar14 * fVar56 + fVar61 * fVar101) * fVar123) & uVar128) * fVar114 +
             fVar31 * fVar17) * fVar102 +
             (fVar10 * fVar32 +
             (float)(~uVar128 & (uint)fVar6 |
                    (uint)((fVar85 * fVar6 + fVar65 * fVar80) * fVar86) & uVar128) * fVar129 +
             (float)(~uVar128 & (uint)fVar3 |
                    (uint)((fVar75 * fVar85 + fVar101 * fVar3) * fVar113) & uVar128) * fVar114 +
             fVar39 * fVar17) * fVar45 +
             (fVar30 * fVar32 + fVar26 * fVar129 + fVar15 * fVar114 + fVar19 * fVar17) *
             auVar83._4_4_;
        *(float *)((long)&in_RDI->field_0 + 8) =
             (fVar27 * fVar36 + fVar24 * fVar131 + fVar16 * fVar117 + fVar20 * fVar21) * fVar37 +
             (fVar35 * fVar36 +
             (float)(~uVar130 & (uint)fVar50 |
                    (uint)((fVar93 * fVar18 + fVar84 * fVar50) * fVar59) & uVar130) * fVar131 +
             (float)(~uVar130 & (uint)fVar56 |
                    (uint)((fVar18 * fVar56 + fVar61 * fVar104) * fVar124) & uVar130) * fVar117 +
             fVar31 * fVar21) * fVar105 +
             (fVar10 * fVar36 +
             (float)(~uVar130 & (uint)fVar6 |
                    (uint)((fVar88 * fVar6 + fVar65 * fVar84) * fVar89) & uVar130) * fVar131 +
             (float)(~uVar130 & (uint)fVar3 |
                    (uint)((fVar75 * fVar88 + fVar104 * fVar3) * fVar116) & uVar130) * fVar117 +
             fVar39 * fVar21) * fVar47 +
             (fVar30 * fVar36 + fVar26 * fVar131 + fVar15 * fVar117 + fVar19 * fVar21) *
             auVar83._8_4_;
        *(float *)((long)&in_RDI->field_0 + 0xc) =
             (fVar27 * fVar40 + fVar24 * fVar133 + fVar16 * fVar119 + fVar20 * fVar25) * fVar41 +
             (fVar35 * fVar40 +
             (float)(~uVar132 & (uint)fVar50 |
                    (uint)((fVar93 * fVar22 + fVar87 * fVar50) * fVar63) & uVar132) * fVar133 +
             (float)(~uVar132 & (uint)fVar56 |
                    (uint)((fVar22 * fVar56 + fVar61 * fVar107) * fVar125) & uVar132) * fVar119 +
             fVar31 * fVar25) * fVar108 +
             (fVar10 * fVar40 +
             (float)(~uVar132 & (uint)fVar6 |
                    (uint)((fVar91 * fVar6 + fVar65 * fVar87) * fVar92) & uVar132) * fVar133 +
             (float)(~uVar132 & (uint)fVar3 |
                    (uint)((fVar75 * fVar91 + fVar107 * fVar3) * fVar118) & uVar132) * fVar119 +
             fVar39 * fVar25) * fVar49 +
             (fVar30 * fVar40 + fVar26 * fVar133 + fVar15 * fVar119 + fVar19 * fVar25) *
             auVar83._12_4_;
        *(float *)((long)&in_RDI->field_0 + 0x10) =
             (fVar44 * fVar28 + fVar42 * fVar127 + fVar34 * fVar111 + fVar38 * fVar112) * fVar29 +
             (fVar48 * fVar28 +
             (float)(~uVar126 & (uint)fVar54 |
                    (uint)((fVar94 * fVar90 + fVar96 * fVar54) * fVar109) & uVar126) * fVar127 +
             (float)(~uVar126 & (uint)fVar60 |
                    (uint)((fVar90 * fVar60 + fVar52 * fVar98) * fVar122) & uVar126) * fVar111 +
             fVar46 * fVar112) * fVar99 +
             (fVar55 * fVar28 +
             (float)(~uVar126 & (uint)fVar7 |
                    (uint)((fVar81 * fVar7 + fVar67 * fVar96) * fVar82) & uVar126) * fVar127 +
             (float)(~uVar126 & (uint)fVar4 |
                    (uint)((fVar77 * fVar81 + fVar98 * fVar4) * fVar110) & uVar126) * fVar111 +
             fVar51 * fVar112) * fVar43 +
             (fVar64 * fVar28 + fVar62 * fVar127 + fVar58 * fVar111 + fVar23 * fVar112) *
             auVar83._0_4_;
        *(float *)((long)&in_RDI->field_0 + 0x14) =
             (fVar44 * fVar32 + fVar42 * fVar129 + fVar34 * fVar114 + fVar38 * fVar17) * fVar33 +
             (fVar48 * fVar32 +
             (float)(~uVar128 & (uint)fVar54 |
                    (uint)((fVar94 * fVar14 + fVar80 * fVar54) * fVar115) & uVar128) * fVar129 +
             (float)(~uVar128 & (uint)fVar60 |
                    (uint)((fVar14 * fVar60 + fVar52 * fVar101) * fVar123) & uVar128) * fVar114 +
             fVar46 * fVar17) * fVar102 +
             (fVar55 * fVar32 +
             (float)(~uVar128 & (uint)fVar7 |
                    (uint)((fVar85 * fVar7 + fVar67 * fVar80) * fVar86) & uVar128) * fVar129 +
             (float)(~uVar128 & (uint)fVar4 |
                    (uint)((fVar77 * fVar85 + fVar101 * fVar4) * fVar113) & uVar128) * fVar114 +
             fVar51 * fVar17) * fVar45 +
             (fVar64 * fVar32 + fVar62 * fVar129 + fVar58 * fVar114 + fVar23 * fVar17) *
             auVar83._4_4_;
        *(float *)((long)&in_RDI->field_0 + 0x18) =
             (fVar44 * fVar36 + fVar42 * fVar131 + fVar34 * fVar117 + fVar38 * fVar21) * fVar37 +
             (fVar48 * fVar36 +
             (float)(~uVar130 & (uint)fVar54 |
                    (uint)((fVar94 * fVar18 + fVar84 * fVar54) * fVar59) & uVar130) * fVar131 +
             (float)(~uVar130 & (uint)fVar60 |
                    (uint)((fVar18 * fVar60 + fVar52 * fVar104) * fVar124) & uVar130) * fVar117 +
             fVar46 * fVar21) * fVar105 +
             (fVar55 * fVar36 +
             (float)(~uVar130 & (uint)fVar7 |
                    (uint)((fVar88 * fVar7 + fVar67 * fVar84) * fVar89) & uVar130) * fVar131 +
             (float)(~uVar130 & (uint)fVar4 |
                    (uint)((fVar77 * fVar88 + fVar104 * fVar4) * fVar116) & uVar130) * fVar117 +
             fVar51 * fVar21) * fVar47 +
             (fVar64 * fVar36 + fVar62 * fVar131 + fVar58 * fVar117 + fVar23 * fVar21) *
             auVar83._8_4_;
        *(float *)((long)&in_RDI->field_0 + 0x1c) =
             (fVar44 * fVar40 + fVar42 * fVar133 + fVar34 * fVar119 + fVar38 * fVar25) * fVar41 +
             (fVar48 * fVar40 +
             (float)(~uVar132 & (uint)fVar54 |
                    (uint)((fVar94 * fVar22 + fVar87 * fVar54) * fVar63) & uVar132) * fVar133 +
             (float)(~uVar132 & (uint)fVar60 |
                    (uint)((fVar22 * fVar60 + fVar52 * fVar107) * fVar125) & uVar132) * fVar119 +
             fVar46 * fVar25) * fVar108 +
             (fVar55 * fVar40 +
             (float)(~uVar132 & (uint)fVar7 |
                    (uint)((fVar91 * fVar7 + fVar67 * fVar87) * fVar92) & uVar132) * fVar133 +
             (float)(~uVar132 & (uint)fVar4 |
                    (uint)((fVar77 * fVar91 + fVar107 * fVar4) * fVar118) & uVar132) * fVar119 +
             fVar51 * fVar25) * fVar49 +
             (fVar64 * fVar40 + fVar62 * fVar133 + fVar58 * fVar119 + fVar23 * fVar25) *
             auVar83._12_4_;
        *(float *)((long)&in_RDI->field_0 + 0x20) =
             (fVar71 * fVar28 + fVar70 * fVar127 + fVar66 * fVar111 + fVar68 * fVar112) * fVar29 +
             (fVar76 * fVar28 +
             (float)(~uVar126 & (uint)fVar57 |
                    (uint)(fVar109 * (fVar95 * fVar90 + fVar96 * fVar57)) & uVar126) * fVar127 +
             (float)(~uVar126 & (uint)fVar2 |
                    (uint)(fVar122 * (fVar90 * fVar2 + fVar72 * fVar98)) & uVar126) * fVar111 +
             fVar74 * fVar112) * fVar99 +
             (fVar97 * fVar28 +
             (float)(~uVar126 & (uint)fVar11 |
                    (uint)(fVar82 * (fVar81 * fVar11 + fVar69 * fVar96)) & uVar126) * fVar127 +
             (float)(~uVar126 & (uint)fVar5 |
                    (uint)(fVar110 * (fVar79 * fVar81 + fVar98 * fVar5)) & uVar126) * fVar111 +
             fVar78 * fVar112) * fVar43 +
             (fVar106 * fVar28 + fVar103 * fVar127 + fVar100 * fVar111 + fVar9 * fVar112) *
             auVar83._0_4_;
        *(float *)((long)&in_RDI->field_0 + 0x24) =
             (fVar71 * fVar32 + fVar70 * fVar129 + fVar66 * fVar114 + fVar68 * fVar17) * fVar33 +
             (fVar76 * fVar32 +
             (float)(~uVar128 & (uint)fVar57 |
                    (uint)(fVar115 * (fVar95 * fVar14 + fVar80 * fVar57)) & uVar128) * fVar129 +
             (float)(~uVar128 & (uint)fVar2 |
                    (uint)(fVar123 * (fVar14 * fVar2 + fVar72 * fVar101)) & uVar128) * fVar114 +
             fVar74 * fVar17) * fVar102 +
             (fVar97 * fVar32 +
             (float)(~uVar128 & (uint)fVar11 |
                    (uint)(fVar86 * (fVar85 * fVar11 + fVar69 * fVar80)) & uVar128) * fVar129 +
             (float)(~uVar128 & (uint)fVar5 |
                    (uint)(fVar113 * (fVar79 * fVar85 + fVar101 * fVar5)) & uVar128) * fVar114 +
             fVar78 * fVar17) * fVar45 +
             (fVar106 * fVar32 + fVar103 * fVar129 + fVar100 * fVar114 + fVar9 * fVar17) *
             auVar83._4_4_;
        *(float *)((long)&in_RDI->field_0 + 0x28) =
             (fVar71 * fVar36 + fVar70 * fVar131 + fVar66 * fVar117 + fVar68 * fVar21) * fVar37 +
             (fVar76 * fVar36 +
             (float)(~uVar130 & (uint)fVar57 |
                    (uint)(fVar59 * (fVar95 * fVar18 + fVar84 * fVar57)) & uVar130) * fVar131 +
             (float)(~uVar130 & (uint)fVar2 |
                    (uint)(fVar124 * (fVar18 * fVar2 + fVar72 * fVar104)) & uVar130) * fVar117 +
             fVar74 * fVar21) * fVar105 +
             (fVar97 * fVar36 +
             (float)(~uVar130 & (uint)fVar11 |
                    (uint)(fVar89 * (fVar88 * fVar11 + fVar69 * fVar84)) & uVar130) * fVar131 +
             (float)(~uVar130 & (uint)fVar5 |
                    (uint)(fVar116 * (fVar79 * fVar88 + fVar104 * fVar5)) & uVar130) * fVar117 +
             fVar78 * fVar21) * fVar47 +
             (fVar106 * fVar36 + fVar103 * fVar131 + fVar100 * fVar117 + fVar9 * fVar21) *
             auVar83._8_4_;
        *(float *)((long)&in_RDI->field_0 + 0x2c) =
             (fVar71 * fVar40 + fVar70 * fVar133 + fVar66 * fVar119 + fVar68 * fVar25) * fVar41 +
             (fVar76 * fVar40 +
             (float)(~uVar132 & (uint)fVar57 |
                    (uint)(fVar63 * (fVar95 * fVar22 + fVar87 * fVar57)) & uVar132) * fVar133 +
             (float)(~uVar132 & (uint)fVar2 |
                    (uint)(fVar125 * (fVar22 * fVar2 + fVar72 * fVar107)) & uVar132) * fVar119 +
             fVar74 * fVar25) * fVar108 +
             (fVar97 * fVar40 +
             (float)(~uVar132 & (uint)fVar11 |
                    (uint)(fVar92 * (fVar91 * fVar11 + fVar69 * fVar87)) & uVar132) * fVar133 +
             (float)(~uVar132 & (uint)fVar5 |
                    (uint)(fVar118 * (fVar79 * fVar91 + fVar107 * fVar5)) & uVar132) * fVar119 +
             fVar78 * fVar25) * fVar49 +
             (fVar106 * fVar40 + fVar103 * fVar133 + fVar100 * fVar119 + fVar9 * fVar25) *
             auVar83._12_4_;
        return in_RDI;
      }
      if (uVar1 == '\x06') {
        fVar9 = patch->patch_v[0][0].field_0.m128[0];
        fVar80 = patch->patch_v[0][1].field_0.m128[0] - fVar9;
        fVar93 = (uu->field_0).v[0];
        fVar94 = (uu->field_0).v[1];
        fVar95 = (uu->field_0).v[2];
        fVar96 = (uu->field_0).v[3];
        fVar61 = fVar80 * fVar93 + fVar9;
        fVar56 = fVar80 * fVar94 + fVar9;
        fVar60 = fVar80 * fVar95 + fVar9;
        fVar9 = fVar80 * fVar96 + fVar9;
        fVar80 = patch->patch_v[0][3].field_0.m128[0];
        fVar57 = patch->patch_v[0][2].field_0.m128[0] - fVar80;
        fVar84 = (vv->field_0).v[0];
        fVar87 = (vv->field_0).v[1];
        fVar90 = (vv->field_0).v[2];
        fVar14 = (vv->field_0).v[3];
        fVar18 = patch->patch_v[0][0].field_0.m128[1];
        fVar22 = patch->patch_v[0][1].field_0.m128[1] - fVar18;
        fVar65 = fVar22 * fVar93 + fVar18;
        fVar67 = fVar22 * fVar94 + fVar18;
        fVar69 = fVar22 * fVar95 + fVar18;
        fVar18 = fVar22 * fVar96 + fVar18;
        fVar22 = patch->patch_v[0][3].field_0.m128[1];
        fVar52 = patch->patch_v[0][2].field_0.m128[1] - fVar22;
        fVar50 = patch->patch_v[0][0].field_0.m128[2];
        fVar54 = patch->patch_v[0][1].field_0.m128[2] - fVar50;
        fVar72 = fVar54 * fVar93 + fVar50;
        fVar75 = fVar54 * fVar94 + fVar50;
        fVar77 = fVar54 * fVar95 + fVar50;
        fVar50 = fVar54 * fVar96 + fVar50;
        fVar54 = patch->patch_v[0][3].field_0.m128[2];
        fVar79 = patch->patch_v[0][2].field_0.m128[2] - fVar54;
        *(float *)&in_RDI->field_0 = ((fVar57 * fVar93 + fVar80) - fVar61) * fVar84 + fVar61;
        *(float *)((long)&in_RDI->field_0 + 4) =
             ((fVar57 * fVar94 + fVar80) - fVar56) * fVar87 + fVar56;
        *(float *)((long)&in_RDI->field_0 + 8) =
             ((fVar57 * fVar95 + fVar80) - fVar60) * fVar90 + fVar60;
        *(float *)((long)&in_RDI->field_0 + 0xc) =
             ((fVar57 * fVar96 + fVar80) - fVar9) * fVar14 + fVar9;
        *(float *)((long)&in_RDI->field_0 + 0x10) =
             ((fVar52 * fVar93 + fVar22) - fVar65) * fVar84 + fVar65;
        *(float *)((long)&in_RDI->field_0 + 0x14) =
             ((fVar52 * fVar94 + fVar22) - fVar67) * fVar87 + fVar67;
        *(float *)((long)&in_RDI->field_0 + 0x18) =
             ((fVar52 * fVar95 + fVar22) - fVar69) * fVar90 + fVar69;
        *(float *)((long)&in_RDI->field_0 + 0x1c) =
             ((fVar52 * fVar96 + fVar22) - fVar18) * fVar14 + fVar18;
        *(float *)((long)&in_RDI->field_0 + 0x20) =
             ((fVar79 * fVar93 + fVar54) - fVar72) * fVar84 + fVar72;
        *(float *)((long)&in_RDI->field_0 + 0x24) =
             ((fVar79 * fVar94 + fVar54) - fVar75) * fVar87 + fVar75;
        *(float *)((long)&in_RDI->field_0 + 0x28) =
             ((fVar79 * fVar95 + fVar54) - fVar77) * fVar90 + fVar77;
        *(float *)((long)&in_RDI->field_0 + 0x2c) =
             ((fVar79 * fVar96 + fVar54) - fVar50) * fVar14 + fVar50;
        return in_RDI;
      }
      *(undefined8 *)((long)&in_RDI->field_0 + 0x20) = 0;
      *(undefined8 *)((long)&in_RDI->field_0 + 0x28) = 0;
      *(undefined8 *)((long)&in_RDI->field_0 + 0x10) = 0;
      *(undefined8 *)((long)&in_RDI->field_0 + 0x18) = 0;
      *(undefined8 *)&in_RDI->field_0 = 0;
      *(undefined8 *)((long)&in_RDI->field_0 + 8) = 0;
      return in_RDI;
    }
    fVar9 = (uu->field_0).v[0];
    fVar93 = (uu->field_0).v[1];
    fVar94 = (uu->field_0).v[2];
    fVar95 = (uu->field_0).v[3];
    fVar90 = 1.0 - fVar9;
    fVar18 = 1.0 - fVar93;
    fVar50 = 1.0 - fVar94;
    fVar57 = 1.0 - fVar95;
    fVar96 = fVar90 * fVar90 * fVar90;
    fVar80 = fVar18 * fVar18 * fVar18;
    fVar84 = fVar50 * fVar50 * fVar50;
    fVar87 = fVar57 * fVar57 * fVar57;
    fVar10 = fVar9 * fVar9 * fVar9;
    fVar15 = fVar93 * fVar93 * fVar93;
    fVar19 = fVar94 * fVar94 * fVar94;
    fVar23 = fVar95 * fVar95 * fVar95;
    fVar14 = fVar90 * fVar9 * fVar90;
    fVar22 = fVar18 * fVar93 * fVar18;
    fVar54 = fVar50 * fVar94 * fVar50;
    fVar61 = fVar57 * fVar95 * fVar57;
    fVar9 = fVar9 * fVar90 * fVar9;
    fVar93 = fVar93 * fVar18 * fVar93;
    fVar94 = fVar94 * fVar50 * fVar94;
    fVar95 = fVar95 * fVar57 * fVar95;
    fVar11 = fVar96 * 0.16666667;
    fVar16 = fVar80 * 0.16666667;
    fVar20 = fVar84 * 0.16666667;
    fVar24 = fVar87 * 0.16666667;
    fVar42 = (fVar9 * 6.0 + fVar14 * 12.0 + fVar96 * 4.0 + fVar10) * 0.16666667;
    fVar44 = (fVar93 * 6.0 + fVar22 * 12.0 + fVar80 * 4.0 + fVar15) * 0.16666667;
    fVar46 = (fVar94 * 6.0 + fVar54 * 12.0 + fVar84 * 4.0 + fVar19) * 0.16666667;
    fVar48 = (fVar95 * 6.0 + fVar61 * 12.0 + fVar87 * 4.0 + fVar23) * 0.16666667;
    fVar27 = (fVar14 * 6.0 + fVar9 * 12.0 + fVar10 * 4.0 + fVar96) * 0.16666667;
    fVar31 = (fVar22 * 6.0 + fVar93 * 12.0 + fVar15 * 4.0 + fVar80) * 0.16666667;
    fVar35 = (fVar54 * 6.0 + fVar94 * 12.0 + fVar19 * 4.0 + fVar84) * 0.16666667;
    fVar39 = (fVar61 * 6.0 + fVar95 * 12.0 + fVar23 * 4.0 + fVar87) * 0.16666667;
    fVar10 = fVar10 * 0.16666667;
    fVar15 = fVar15 * 0.16666667;
    fVar19 = fVar19 * 0.16666667;
    fVar23 = fVar23 * 0.16666667;
    fVar9 = (vv->field_0).v[0];
    fVar93 = (vv->field_0).v[1];
    fVar94 = (vv->field_0).v[2];
    fVar95 = (vv->field_0).v[3];
    fVar96 = 1.0 - fVar9;
    fVar84 = 1.0 - fVar93;
    fVar90 = 1.0 - fVar94;
    fVar18 = 1.0 - fVar95;
    fVar50 = fVar96 * fVar96 * fVar96;
    fVar54 = fVar84 * fVar84 * fVar84;
    fVar57 = fVar90 * fVar90 * fVar90;
    fVar61 = fVar18 * fVar18 * fVar18;
    fVar64 = fVar9 * fVar9 * fVar9;
    fVar66 = fVar93 * fVar93 * fVar93;
    fVar68 = fVar94 * fVar94 * fVar94;
    fVar70 = fVar95 * fVar95 * fVar95;
    fVar80 = fVar96 * fVar9 * fVar96;
    fVar87 = fVar84 * fVar93 * fVar84;
    fVar14 = fVar90 * fVar94 * fVar90;
    fVar22 = fVar18 * fVar95 * fVar18;
    fVar9 = fVar9 * fVar96 * fVar9;
    fVar93 = fVar93 * fVar84 * fVar93;
    fVar94 = fVar94 * fVar90 * fVar94;
    fVar95 = fVar95 * fVar18 * fVar95;
    fVar51 = fVar50 * 0.16666667;
    fVar55 = fVar54 * 0.16666667;
    fVar58 = fVar57 * 0.16666667;
    fVar62 = fVar61 * 0.16666667;
    fVar71 = (fVar9 * 6.0 + fVar80 * 12.0 + fVar50 * 4.0 + fVar64) * 0.16666667;
    fVar74 = (fVar93 * 6.0 + fVar87 * 12.0 + fVar54 * 4.0 + fVar66) * 0.16666667;
    fVar76 = (fVar94 * 6.0 + fVar14 * 12.0 + fVar57 * 4.0 + fVar68) * 0.16666667;
    fVar78 = (fVar95 * 6.0 + fVar22 * 12.0 + fVar61 * 4.0 + fVar70) * 0.16666667;
    fVar26 = (fVar80 * 6.0 + fVar9 * 12.0 + fVar64 * 4.0 + fVar50) * 0.16666667;
    fVar30 = (fVar87 * 6.0 + fVar93 * 12.0 + fVar66 * 4.0 + fVar54) * 0.16666667;
    fVar34 = (fVar14 * 6.0 + fVar94 * 12.0 + fVar68 * 4.0 + fVar57) * 0.16666667;
    fVar38 = (fVar22 * 6.0 + fVar95 * 12.0 + fVar70 * 4.0 + fVar61) * 0.16666667;
    fVar64 = fVar64 * 0.16666667;
    fVar66 = fVar66 * 0.16666667;
    fVar68 = fVar68 * 0.16666667;
    fVar70 = fVar70 * 0.16666667;
    fVar93 = patch->patch_v[0][0].field_0.m128[0];
    fVar94 = patch->patch_v[1][0].field_0.m128[0];
    fVar95 = patch->patch_v[2][0].field_0.m128[0];
    fVar96 = patch->patch_v[3][0].field_0.m128[0];
    fVar80 = patch->patch_v[0][1].field_0.m128[0];
    fVar84 = patch->patch_v[1][1].field_0.m128[0];
    fVar87 = patch->patch_v[2][1].field_0.m128[0];
    fVar90 = patch->patch_v[3][1].field_0.m128[0];
    fVar14 = patch->patch_v[0][2].field_0.m128[0];
    fVar18 = patch->patch_v[1][2].field_0.m128[0];
    fVar22 = patch->patch_v[2][2].field_0.m128[0];
    fVar50 = patch->patch_v[3][2].field_0.m128[0];
    fVar54 = patch->patch_v[2][3].field_0.m128[0];
    fVar57 = patch->patch_v[3][3].field_0.m128[0];
    fVar9 = patch->patch_v[3][3].field_0.m128[1];
    fVar61 = patch->patch_v[1][3].field_0.m128[0];
    fVar52 = patch->patch_v[0][3].field_0.m128[0];
    fVar56 = patch->patch_v[0][0].field_0.m128[1];
    fVar60 = patch->patch_v[1][0].field_0.m128[1];
    fVar65 = patch->patch_v[2][0].field_0.m128[1];
    fVar67 = patch->patch_v[3][0].field_0.m128[1];
    fVar69 = patch->patch_v[0][1].field_0.m128[1];
    fVar72 = patch->patch_v[2][1].field_0.m128[1];
    fVar75 = patch->patch_v[3][1].field_0.m128[1];
    fVar77 = patch->patch_v[1][1].field_0.m128[1];
    fVar79 = patch->patch_v[2][2].field_0.m128[1];
    fVar2 = patch->patch_v[3][2].field_0.m128[1];
    fVar3 = patch->patch_v[1][2].field_0.m128[1];
    fVar4 = patch->patch_v[0][2].field_0.m128[1];
    fVar5 = patch->patch_v[2][3].field_0.m128[1];
    fVar6 = patch->patch_v[1][3].field_0.m128[1];
    fVar7 = patch->patch_v[0][3].field_0.m128[1];
    fVar97 = (fVar56 * fVar51 + fVar60 * fVar71 + fVar65 * fVar26 + fVar67 * fVar64) * fVar11 +
             (fVar69 * fVar51 + fVar77 * fVar71 + fVar72 * fVar26 + fVar75 * fVar64) * fVar42 +
             (fVar4 * fVar51 + fVar3 * fVar71 + fVar79 * fVar26 + fVar2 * fVar64) * fVar27 +
             (fVar7 * fVar51 + fVar6 * fVar71 + fVar5 * fVar26 + fVar9 * fVar64) * fVar10;
    fVar100 = (fVar56 * fVar55 + fVar60 * fVar74 + fVar65 * fVar30 + fVar67 * fVar66) * fVar16 +
              (fVar69 * fVar55 + fVar77 * fVar74 + fVar72 * fVar30 + fVar75 * fVar66) * fVar44 +
              (fVar4 * fVar55 + fVar3 * fVar74 + fVar79 * fVar30 + fVar2 * fVar66) * fVar31 +
              (fVar7 * fVar55 + fVar6 * fVar74 + fVar5 * fVar30 + fVar9 * fVar66) * fVar15;
    fVar103 = (fVar56 * fVar58 + fVar60 * fVar76 + fVar65 * fVar34 + fVar67 * fVar68) * fVar20 +
              (fVar69 * fVar58 + fVar77 * fVar76 + fVar72 * fVar34 + fVar75 * fVar68) * fVar46 +
              (fVar4 * fVar58 + fVar3 * fVar76 + fVar79 * fVar34 + fVar2 * fVar68) * fVar35 +
              (fVar7 * fVar58 + fVar6 * fVar76 + fVar5 * fVar34 + fVar9 * fVar68) * fVar19;
    fVar106 = (fVar56 * fVar62 + fVar60 * fVar78 + fVar65 * fVar38 + fVar67 * fVar70) * fVar24 +
              (fVar69 * fVar62 + fVar77 * fVar78 + fVar72 * fVar38 + fVar75 * fVar70) * fVar48 +
              (fVar4 * fVar62 + fVar3 * fVar78 + fVar79 * fVar38 + fVar2 * fVar70) * fVar39 +
              (fVar7 * fVar62 + fVar6 * fVar78 + fVar5 * fVar38 + fVar9 * fVar70) * fVar23;
    fVar56 = patch->patch_v[0][0].field_0.m128[2];
    fVar60 = patch->patch_v[1][0].field_0.m128[2];
    fVar65 = patch->patch_v[2][0].field_0.m128[2];
    fVar67 = patch->patch_v[3][0].field_0.m128[2];
    fVar69 = patch->patch_v[0][1].field_0.m128[2];
    fVar72 = patch->patch_v[2][1].field_0.m128[2];
    fVar75 = patch->patch_v[3][1].field_0.m128[2];
    fVar77 = patch->patch_v[1][1].field_0.m128[2];
    fVar79 = patch->patch_v[2][2].field_0.m128[2];
    fVar2 = patch->patch_v[3][2].field_0.m128[2];
    fVar3 = patch->patch_v[1][2].field_0.m128[2];
    fVar4 = patch->patch_v[0][2].field_0.m128[2];
    fVar9 = patch->patch_v[3][3].field_0.m128[2];
    fVar5 = patch->patch_v[2][3].field_0.m128[2];
    fVar6 = patch->patch_v[1][3].field_0.m128[2];
    fVar7 = patch->patch_v[0][3].field_0.m128[2];
    fVar109 = (fVar56 * fVar51 + fVar60 * fVar71 + fVar65 * fVar26 + fVar67 * fVar64) * fVar11 +
              (fVar69 * fVar51 + fVar77 * fVar71 + fVar72 * fVar26 + fVar75 * fVar64) * fVar42 +
              (fVar4 * fVar51 + fVar3 * fVar71 + fVar79 * fVar26 + fVar2 * fVar64) * fVar27 +
              (fVar7 * fVar51 + fVar6 * fVar71 + fVar5 * fVar26 + fVar9 * fVar64) * fVar10;
    fVar112 = (fVar56 * fVar55 + fVar60 * fVar74 + fVar65 * fVar30 + fVar67 * fVar66) * fVar16 +
              (fVar69 * fVar55 + fVar77 * fVar74 + fVar72 * fVar30 + fVar75 * fVar66) * fVar44 +
              (fVar4 * fVar55 + fVar3 * fVar74 + fVar79 * fVar30 + fVar2 * fVar66) * fVar31 +
              (fVar7 * fVar55 + fVar6 * fVar74 + fVar5 * fVar30 + fVar9 * fVar66) * fVar15;
    fVar115 = (fVar56 * fVar58 + fVar60 * fVar76 + fVar65 * fVar34 + fVar67 * fVar68) * fVar20 +
              (fVar69 * fVar58 + fVar77 * fVar76 + fVar72 * fVar34 + fVar75 * fVar68) * fVar46 +
              (fVar4 * fVar58 + fVar3 * fVar76 + fVar79 * fVar34 + fVar2 * fVar68) * fVar35 +
              (fVar7 * fVar58 + fVar6 * fVar76 + fVar5 * fVar34 + fVar9 * fVar68) * fVar19;
    fVar9 = (fVar56 * fVar62 + fVar60 * fVar78 + fVar65 * fVar38 + fVar67 * fVar70) * fVar24 +
            (fVar69 * fVar62 + fVar77 * fVar78 + fVar72 * fVar38 + fVar75 * fVar70) * fVar48 +
            (fVar4 * fVar62 + fVar3 * fVar78 + fVar79 * fVar38 + fVar2 * fVar70) * fVar39 +
            (fVar7 * fVar62 + fVar6 * fVar78 + fVar5 * fVar38 + fVar9 * fVar70) * fVar23;
    *(float *)&in_RDI->field_0 =
         (fVar93 * fVar51 + fVar94 * fVar71 + fVar95 * fVar26 + fVar96 * fVar64) * fVar11 +
         (fVar80 * fVar51 + fVar84 * fVar71 + fVar87 * fVar26 + fVar90 * fVar64) * fVar42 +
         (fVar14 * fVar51 + fVar18 * fVar71 + fVar22 * fVar26 + fVar50 * fVar64) * fVar27 +
         (fVar52 * fVar51 + fVar61 * fVar71 + fVar54 * fVar26 + fVar57 * fVar64) * fVar10;
    *(float *)((long)&in_RDI->field_0 + 4) =
         (fVar93 * fVar55 + fVar94 * fVar74 + fVar95 * fVar30 + fVar96 * fVar66) * fVar16 +
         (fVar80 * fVar55 + fVar84 * fVar74 + fVar87 * fVar30 + fVar90 * fVar66) * fVar44 +
         (fVar14 * fVar55 + fVar18 * fVar74 + fVar22 * fVar30 + fVar50 * fVar66) * fVar31 +
         (fVar52 * fVar55 + fVar61 * fVar74 + fVar54 * fVar30 + fVar57 * fVar66) * fVar15;
    *(float *)((long)&in_RDI->field_0 + 8) =
         (fVar93 * fVar58 + fVar94 * fVar76 + fVar95 * fVar34 + fVar96 * fVar68) * fVar20 +
         (fVar80 * fVar58 + fVar84 * fVar76 + fVar87 * fVar34 + fVar90 * fVar68) * fVar46 +
         (fVar14 * fVar58 + fVar18 * fVar76 + fVar22 * fVar34 + fVar50 * fVar68) * fVar35 +
         (fVar52 * fVar58 + fVar61 * fVar76 + fVar54 * fVar34 + fVar57 * fVar68) * fVar19;
    *(float *)((long)&in_RDI->field_0 + 0xc) =
         (fVar93 * fVar62 + fVar94 * fVar78 + fVar95 * fVar38 + fVar96 * fVar70) * fVar24 +
         (fVar80 * fVar62 + fVar84 * fVar78 + fVar87 * fVar38 + fVar90 * fVar70) * fVar48 +
         (fVar14 * fVar62 + fVar18 * fVar78 + fVar22 * fVar38 + fVar50 * fVar70) * fVar39 +
         (fVar52 * fVar62 + fVar61 * fVar78 + fVar54 * fVar38 + fVar57 * fVar70) * fVar23;
  }
  *(float *)((long)&in_RDI->field_0 + 0x10) = fVar97;
  *(float *)((long)&in_RDI->field_0 + 0x14) = fVar100;
  *(float *)((long)&in_RDI->field_0 + 0x18) = fVar103;
  *(float *)((long)&in_RDI->field_0 + 0x1c) = fVar106;
  *(float *)((long)&in_RDI->field_0 + 0x20) = fVar109;
  *(float *)((long)&in_RDI->field_0 + 0x24) = fVar112;
  *(float *)((long)&in_RDI->field_0 + 0x28) = fVar115;
  *(float *)((long)&in_RDI->field_0 + 0x2c) = fVar9;
  return in_RDI;
}

Assistant:

Vec3<simdf> patchEval(const SubdivPatch1Base& patch, const simdf& uu, const simdf& vv) 
    {
      if (likely(patch.type == SubdivPatch1Base::BEZIER_PATCH))
        return ((BezierPatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::BSPLINE_PATCH))
        return ((BSplinePatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::GREGORY_PATCH))
        return ((DenseGregoryPatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::BILINEAR_PATCH))
        return ((BilinearPatch3fa*)patch.patch_v)->eval(uu,vv);
      return Vec3<simdf>( zero );
    }